

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbiter.cpp
# Opt level: O2

unique_ptr<std::vector<char,_std::allocator<char>_>,_std::default_delete<std::vector<char,_std::allocator<char>_>_>_>
 __thiscall arbiter::Arbiter::tryGetBinary(Arbiter *this,string *path)

{
  string *in_RDX;
  _Alloc_hider local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  string local_80;
  string local_60;
  string local_40 [32];
  
  ::std::__cxx11::string::string(local_40,in_RDX);
  getDriver((Arbiter *)&local_90,path);
  ::std::__cxx11::string::string((string *)&local_80,in_RDX);
  stripProtocol(&local_60,&local_80);
  Driver::tryGetBinary((Driver *)this,(string *)local_90._M_p);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  ::std::__cxx11::string::~string(local_40);
  return (__uniq_ptr_data<std::vector<char,_std::allocator<char>_>,_std::default_delete<std::vector<char,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<char,_std::allocator<char>_>,_std::default_delete<std::vector<char,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::vector<char>> Arbiter::tryGetBinary(std::string path) const
{
    return getDriver(path)->tryGetBinary(stripProtocol(path));
}